

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ring_buffer.cpp
# Opt level: O2

void basic_api_test<ring_buffer_base<short>>(ring_buffer_base<short> *ring)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  AssertHelper local_58;
  AssertionResult gtest_ar;
  String local_40;
  int rv;
  AssertHelper local_28;
  
  local_40.c_str_._0_4_ = ring->capacity_ + -1;
  local_58.data_._0_4_ = 0x80;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"ring.capacity()","128",(int *)&local_40,(int *)&local_58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    iVar2 = 0x82;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    iVar2 = (ring->read_index_).super___atomic_base<int>._M_i;
    iVar1 = (ring->write_index_).super___atomic_base<int>._M_i;
    local_40.c_str_._0_4_ = 0;
    if (iVar1 < iVar2) {
      local_40.c_str_._0_4_ = ring->capacity_;
    }
    local_40.c_str_._0_4_ = (iVar1 - iVar2) + (int)local_40.c_str_;
    local_58.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"ring.available_read()","0",(int *)&local_40,(int *)&local_58);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_40);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      iVar2 = 0x84;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_40.c_str_._0_4_ = ring_buffer_base<short>::available_write(ring);
      local_58.data_._0_4_ = 0x80;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"ring.available_write()","128",(int *)&local_40,
                 (int *)&local_58);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_40);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar2 = 0x85;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        rv = ring_buffer_base<short>::enqueue_default(ring,0x3f);
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        gtest_ar.success_ = rv == 0x3f;
        if (!gtest_ar.success_) {
          testing::Message::Message((Message *)&local_58);
          testing::internal::GetBoolAssertionFailureMessage
                    ((internal *)&local_40,&gtest_ar,"rv == 63","false","true");
          testing::internal::AssertHelper::AssertHelper
                    (&local_28,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                     ,0x89,(char *)CONCAT44(local_40.c_str_._4_4_,(int)local_40.c_str_));
          testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_28);
          testing::internal::String::~String(&local_40);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_58);
          goto LAB_0011ae49;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        iVar2 = (ring->read_index_).super___atomic_base<int>._M_i;
        iVar1 = (ring->write_index_).super___atomic_base<int>._M_i;
        local_40.c_str_._0_4_ = 0;
        if (iVar1 < iVar2) {
          local_40.c_str_._0_4_ = ring->capacity_;
        }
        local_40.c_str_._0_4_ = (iVar1 - iVar2) + (int)local_40.c_str_;
        local_58.data_._0_4_ = 0x3f;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"ring.available_read()","63",(int *)&local_40,
                   (int *)&local_58);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_40);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          iVar2 = 0x8a;
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          local_40.c_str_._0_4_ = ring_buffer_base<short>::available_write(ring);
          local_58.data_._0_4_ = 0x41;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"ring.available_write()","65",(int *)&local_40,
                     (int *)&local_58);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_40);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            iVar2 = 0x8b;
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            rv = ring_buffer_base<short>::enqueue_default(ring,0x41);
            local_40.c_str_._0_4_ = 0x41;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"rv","65",&rv,(int *)&local_40);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_40);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              iVar2 = 0x8f;
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              iVar2 = (ring->read_index_).super___atomic_base<int>._M_i;
              iVar1 = (ring->write_index_).super___atomic_base<int>._M_i;
              local_40.c_str_._0_4_ = 0;
              if (iVar1 < iVar2) {
                local_40.c_str_._0_4_ = ring->capacity_;
              }
              local_40.c_str_._0_4_ = (iVar1 - iVar2) + (int)local_40.c_str_;
              local_58.data_._0_4_ = 0x80;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"ring.available_read()","128",(int *)&local_40,
                         (int *)&local_58);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&local_40);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                iVar2 = 0x90;
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar.message_);
                local_40.c_str_._0_4_ = ring_buffer_base<short>::available_write(ring);
                local_58.data_._0_4_ = 0;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"ring.available_write()","0",(int *)&local_40,
                           (int *)&local_58);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&local_40);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar3 = "";
                  }
                  else {
                    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  iVar2 = 0x91;
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  iVar4 = 0;
                  rv = ring_buffer_base<short>::dequeue(ring,(short *)0x0,0x3f);
                  iVar2 = (ring->read_index_).super___atomic_base<int>._M_i;
                  iVar1 = (ring->write_index_).super___atomic_base<int>._M_i;
                  if (iVar1 < iVar2) {
                    iVar4 = ring->capacity_;
                  }
                  local_40.c_str_._0_4_ = (iVar1 - iVar2) + iVar4;
                  local_58.data_._0_4_ = 0x41;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"ring.available_read()","65",(int *)&local_40,
                             (int *)&local_58);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&local_40);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    iVar2 = 0x95;
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar.message_);
                    local_40.c_str_._0_4_ = ring_buffer_base<short>::available_write(ring);
                    local_58.data_._0_4_ = 0x3f;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&gtest_ar,"ring.available_write()","63",(int *)&local_40,
                               (int *)&local_58);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&local_40);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar3 = "";
                      }
                      else {
                        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      iVar2 = 0x96;
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&gtest_ar.message_);
                      iVar4 = 0;
                      rv = ring_buffer_base<short>::dequeue(ring,(short *)0x0,0x41);
                      iVar2 = (ring->read_index_).super___atomic_base<int>._M_i;
                      iVar1 = (ring->write_index_).super___atomic_base<int>._M_i;
                      if (iVar1 < iVar2) {
                        iVar4 = ring->capacity_;
                      }
                      local_40.c_str_._0_4_ = (iVar1 - iVar2) + iVar4;
                      local_58.data_._0_4_ = 0;
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&gtest_ar,"ring.available_read()","0",(int *)&local_40,
                                 (int *)&local_58);
                      if (gtest_ar.success_ != false) {
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr(&gtest_ar.message_);
                        local_40.c_str_._0_4_ = ring_buffer_base<short>::available_write(ring);
                        local_58.data_._0_4_ = 0x80;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)&gtest_ar,"ring.available_write()","128",
                                   (int *)&local_40,(int *)&local_58);
                        if (gtest_ar.success_ == false) {
                          testing::Message::Message((Message *)&local_40);
                          if (gtest_ar.message_.ptr_ ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar3 = "";
                          }
                          else {
                            pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_58,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                                     ,0x9b,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_40)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_58);
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&local_40);
                        }
                        goto LAB_0011ae49;
                      }
                      testing::Message::Message((Message *)&local_40);
                      if (gtest_ar.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar3 = "";
                      }
                      else {
                        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      iVar2 = 0x9a;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
             ,iVar2,pcVar3);
  testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_40);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_40);
LAB_0011ae49:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void basic_api_test(T& ring)
{
  ASSERT_EQ(ring.capacity(), 128);

  ASSERT_EQ(ring.available_read(), 0);
  ASSERT_EQ(ring.available_write(), 128);

  int rv = ring.enqueue_default(63);

  ASSERT_TRUE(rv == 63);
  ASSERT_EQ(ring.available_read(), 63);
  ASSERT_EQ(ring.available_write(), 65);

  rv = ring.enqueue_default(65);

  ASSERT_EQ(rv, 65);
  ASSERT_EQ(ring.available_read(), 128);
  ASSERT_EQ(ring.available_write(), 0);

  rv = ring.dequeue(nullptr, 63);

  ASSERT_EQ(ring.available_read(), 65);
  ASSERT_EQ(ring.available_write(), 63);

  rv = ring.dequeue(nullptr, 65);

  ASSERT_EQ(ring.available_read(), 0);
  ASSERT_EQ(ring.available_write(), 128);
}